

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

void __thiscall ipx::LpSolver::ClearIPMStartingPoint(LpSolver *this)

{
  double in_RDI;
  valarray<double> *unaff_retaddr;
  double __n;
  
  __n = in_RDI;
  std::valarray<double>::resize(unaff_retaddr,(size_t)in_RDI,in_RDI);
  std::valarray<double>::resize(unaff_retaddr,(size_t)__n,in_RDI);
  std::valarray<double>::resize(unaff_retaddr,(size_t)__n,in_RDI);
  std::valarray<double>::resize(unaff_retaddr,(size_t)__n,in_RDI);
  std::valarray<double>::resize(unaff_retaddr,(size_t)__n,in_RDI);
  std::valarray<double>::resize(unaff_retaddr,(size_t)__n,in_RDI);
  return;
}

Assistant:

void LpSolver::ClearIPMStartingPoint() {
    x_start_.resize(0);
    xl_start_.resize(0);
    xu_start_.resize(0);
    y_start_.resize(0);
    zl_start_.resize(0);
    zu_start_.resize(0);
}